

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZGeoBlend<pzgeom::TPZGeoPyramid> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  long lVar1;
  
  TPZNodeRep<5,_pztopology::TPZPyramid>::TPZNodeRep
            ((TPZNodeRep<5,_pztopology::TPZPyramid> *)this,&PTR_PTR_018b64e0,
             (TPZNodeRep<5,_pztopology::TPZPyramid> *)cp,gl2lcNdMap);
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.super_TPZPyramid.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_018b6480;
  lVar1 = 0x48;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar1 + -0x18) = &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar1 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar1 + -0x10) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1b0);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0x1a0 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x1860);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please implement me\n",0x14);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x35);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp, std::map<int64_t, int64_t> &gl2lcNdMap) : TPZRegisterClassId(
                &TPZGeoBlend::ClassId), TGeo(cp, gl2lcNdMap) {
             std::cout << "Please implement me\n";
             DebugStop();
        }